

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                  *this,Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra> *container,
                 MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pMVar2;
  pointer pbVar3;
  bool bVar4;
  MatchResultListener *pMVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  size_t count;
  NodeBase *pNVar10;
  long lVar11;
  size_t sVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  long *local_1e8 [2];
  long local_1d8 [2];
  undefined1 local_1c8 [32];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_1c8);
  uVar6 = (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar7 = (ulong)uVar6;
  if (uVar6 == (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    uVar7 = 0;
    pNVar10 = (NodeBase *)0x0;
  }
  else {
    pNVar10 = (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar7];
    if (pNVar10 == (NodeBase *)0x0) {
      google::protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  if (pNVar10 == (NodeBase *)0x0) {
    sVar12 = 0;
    bVar9 = false;
  }
  else {
    sVar12 = 0;
    do {
      bVar9 = false;
      pMVar2 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (sVar12 == ((long)(this->matchers_).
                           super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
                    -0x5555555555555555) break;
      if (poVar1 == (ostream *)0x0) {
        local_1c8._8_8_ = (ostream *)0x0;
        local_1c8._0_8_ = &PTR__MatchResultListener_018ce6e0;
        bVar4 = MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                ::MatchAndExplain(&pMVar2[sVar12].
                                   super_MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                                  ,(pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>
                                    *)(pNVar10 + 1),(MatchResultListener *)local_1c8);
      }
      else {
        local_1c8._8_8_ = local_1a8;
        local_1c8._0_8_ = &PTR__StringMatchResultListener_018ce748;
        std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
        bVar4 = MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                ::MatchAndExplain(&(this->matchers_).
                                   super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[sVar12].
                                   super_MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                                  ,(pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>
                                    *)(pNVar10 + 1),(MatchResultListener *)local_1c8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)
                   (local_200.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + sVar12),(string *)local_1e8);
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        local_1c8._0_8_ = &PTR__StringMatchResultListener_018ce748;
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
        std::ios_base::~ios_base(local_138);
      }
      bVar9 = false;
      if (bVar4 == false) {
        bVar9 = true;
        break;
      }
      pNVar10 = pNVar10->next;
      if (pNVar10 == (NodeBase *)0x0) {
        do {
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
          if ((container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar6
             ) {
            pNVar10 = (NodeBase *)0x0;
            uVar7 = 0;
            break;
          }
          pNVar10 = (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar6];
        } while (pNVar10 == (NodeBase *)0x0);
      }
      sVar12 = sVar12 + 1;
    } while (pNVar10 != (NodeBase *)0x0);
  }
  count = sVar12;
  if (pNVar10 != (NodeBase *)0x0) {
    do {
      pNVar10 = pNVar10->next;
      while (pNVar10 == (NodeBase *)0x0) {
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
        if ((container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar6)
        {
          pNVar10 = (NodeBase *)0x0;
          uVar7 = 0;
          break;
        }
        pNVar10 = (container->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar6];
      }
      count = count + 1;
    } while (pNVar10 != (NodeBase *)0x0);
  }
  if (count == ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    if (!bVar9) {
      bVar9 = true;
      if ((poVar1 != (ostream *)0x0) &&
         ((this->matchers_).
          super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->matchers_).
          super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        lVar11 = 8;
        bVar4 = false;
        lVar8 = 0;
        do {
          pbVar3 = local_200.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&((local_200.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11) != 0) {
            if (bVar4) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
            }
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
            bVar4 = true;
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar5->stream_,*(char **)((long)pbVar3 + lVar11 + -8),
                         *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar11));
            }
          }
          lVar8 = lVar8 + 1;
          lVar11 = lVar11 + 0x20;
        } while (lVar8 != ((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555);
      }
      goto LAB_00851026;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar5->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
      }
      MatchResultListener::operator<<(pMVar5,(char (*) [15])" doesn\'t match");
      poVar1 = listener->stream_;
      bVar9 = false;
      if ((poVar1 == (ostream *)0x0) ||
         (bVar9 = false,
         local_200.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_string_length == 0))
      goto LAB_00851026;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_200.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_dataplus._M_p,
                 local_200.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_string_length);
    }
  }
  else {
    bVar9 = false;
    if ((poVar1 == (ostream *)0x0) || (count == 0)) goto LAB_00851026;
    pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_google::protobuf::Map<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
              *)local_1c8,count);
    MatchResultListener::operator<<(pMVar5,(Message *)local_1c8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_1c8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_1c8._0_8_ + 8))();
    }
  }
  bVar9 = false;
LAB_00851026:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return bVar9;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }